

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O0

int __thiscall embree::CoronaLoader::load<int>(CoronaLoader *this,Ref<embree::XML> *xml)

{
  int iVar1;
  size_type sVar2;
  runtime_error *this_00;
  long *in_RSI;
  ParseLocation *in_stack_00000028;
  char *__rhs;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff8c;
  string local_48 [24];
  Token *in_stack_ffffffffffffffd0;
  
  sVar2 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                    ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RSI + 0x98));
  if (sVar2 == 0) {
    uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffff88);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    __rhs = (char *)*in_RSI;
    ParseLocation::str_abi_cxx11_(in_stack_00000028);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff8c,uVar3),__rhs);
    std::runtime_error::runtime_error(this_00,local_48);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RSI + 0x98),0);
  iVar1 = Token::Int(in_stack_ffffffffffffffd0);
  return iVar1;
}

Assistant:

int CoronaLoader::load<int>(const Ref<XML>& xml) {
    if (xml->body.size() < 1) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong int body");
    return xml->body[0].Int();
  }